

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_std.cc
# Opt level: O0

bool __thiscall benchmark::Regex::Match(Regex *this,string *str)

{
  string *str_local;
  Regex *this_local;
  
  if ((this->init_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         std::
         regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                   (str,&this->re_,0);
  }
  return this_local._7_1_;
}

Assistant:

bool Regex::Match(const std::string& str) {
  if (!init_) {
    return false;
  }

  return std::regex_search(str, re_);
}